

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

Stmt * __thiscall kratos::Stmt::pre_stmt(Stmt *this)

{
  IRNode *pIVar1;
  ulong uVar2;
  shared_ptr<kratos::StmtBlock> sVar3;
  Stmt *local_38;
  pointer local_28;
  
  pIVar1 = this->parent_;
  if (((pIVar1 == (IRNode *)0x0) || (pIVar1->ast_node_type_ != StmtKind)) ||
     (*(int *)&pIVar1[1].fn_name_ln.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish != 4)) {
    local_38 = (Stmt *)0x0;
  }
  else {
    sVar3 = as<kratos::StmtBlock>((Stmt *)&stack0xffffffffffffffd8);
    uVar2 = (**(code **)((local_28->first)._M_dataplus._M_p + 0x18))
                      (local_28,this,
                       sVar3.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._M_pi);
    if ((uVar2 == 0) ||
       ((ulong)((long)local_28[5].first._M_dataplus._M_p - *(long *)&local_28[4].second >> 4) <=
        uVar2)) {
      local_38 = (Stmt *)0x0;
    }
    else {
      StmtBlock::operator[]((StmtBlock *)&stack0xffffffffffffffc8,(uint32_t)local_28);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd0);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
  }
  return local_38;
}

Assistant:

Stmt *Stmt::pre_stmt() const {
    if (!parent_ || parent_->ir_node_kind() != IRNodeKind::StmtKind) return nullptr;
    auto *stmt_parent = reinterpret_cast<Stmt *>(parent_);
    if (stmt_parent->type_ != StatementType::Block) return nullptr;
    auto const &block = stmt_parent->as<StmtBlock>();
    auto index = block->index_of(this);
    if (index != 0 && index < block->size()) {
        return (*block)[index - 1].get();
    }
    return nullptr;
}